

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint readChunk_zTXt(LodePNGInfo *info,LodePNGDecoderSettings *decoder,uchar *data,size_t chunkLength
                   )

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *key;
  ulong __n;
  ulong uVar4;
  uchar *str;
  size_t size;
  LodePNGDecompressSettings zlibsettings;
  uchar *local_78;
  LodePNGInfo *local_70;
  size_t local_68;
  size_t local_60;
  LodePNGDecompressSettings local_58;
  
  local_58.custom_context = (decoder->zlibsettings).custom_context;
  local_58.ignore_adler32 = (decoder->zlibsettings).ignore_adler32;
  local_58.ignore_nlen = (decoder->zlibsettings).ignore_nlen;
  local_58.max_output_size = (decoder->zlibsettings).max_output_size;
  local_58.custom_zlib = (decoder->zlibsettings).custom_zlib;
  local_58.custom_inflate = (decoder->zlibsettings).custom_inflate;
  local_78 = (uchar *)0x0;
  local_60 = 0;
  __n = 0;
  if (chunkLength != 0) {
    __n = 0;
    do {
      if (data[__n] == '\0') break;
      __n = (ulong)((int)__n + 1);
    } while (__n < chunkLength);
  }
  iVar1 = (int)__n;
  uVar4 = (ulong)(iVar1 + 2U);
  if (uVar4 < chunkLength) {
    if (iVar1 - 0x50U < 0xffffffb1) {
      uVar3 = 0x59;
    }
    else {
      local_68 = __n + 1;
      local_70 = info;
      key = (char *)malloc(local_68);
      if (key != (char *)0x0) {
        if (iVar1 != 0) {
          memcpy(key,data,__n);
        }
        key[__n] = '\0';
        if (data[local_68] != '\0') {
          uVar3 = 0x48;
          goto LAB_001c86ea;
        }
        if (uVar4 <= chunkLength) {
          local_58.max_output_size = decoder->max_text_size;
          uVar2 = zlib_decompress(&local_78,&local_60,0,data + uVar4,
                                  (ulong)((int)chunkLength - (iVar1 + 2U)),&local_58);
          uVar3 = 0x70;
          if (local_60 <= local_58.max_output_size) {
            uVar3 = uVar2;
          }
          if (uVar2 == 0) {
            uVar3 = uVar2;
          }
          if (uVar3 == 0) {
            uVar3 = lodepng_add_text_sized(local_70,key,(char *)local_78,local_60);
          }
          goto LAB_001c86ea;
        }
        goto LAB_001c8694;
      }
      uVar3 = 0x53;
    }
    key = (char *)0x0;
  }
  else {
    key = (char *)0x0;
LAB_001c8694:
    uVar3 = 0x4b;
  }
LAB_001c86ea:
  free(key);
  free(local_78);
  return uVar3;
}

Assistant:

static unsigned readChunk_zTXt(LodePNGInfo* info, const LodePNGDecoderSettings* decoder,
                               const unsigned char* data, size_t chunkLength) {
  unsigned error = 0;

  /*copy the object to change parameters in it*/
  LodePNGDecompressSettings zlibsettings = decoder->zlibsettings;

  unsigned length, string2_begin;
  char *key = 0;
  unsigned char* str = 0;
  size_t size = 0;

  while(!error) /*not really a while loop, only used to break on error*/ {
    for(length = 0; length < chunkLength && data[length] != 0; ++length) ;
    if(length + 2 >= chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/
    if(length < 1 || length > 79) CERROR_BREAK(error, 89); /*keyword too short or long*/

    key = (char*)lodepng_malloc(length + 1);
    if(!key) CERROR_BREAK(error, 83); /*alloc fail*/

    lodepng_memcpy(key, data, length);
    key[length] = 0;

    if(data[length + 1] != 0) CERROR_BREAK(error, 72); /*the 0 byte indicating compression must be 0*/

    string2_begin = length + 2;
    if(string2_begin > chunkLength) CERROR_BREAK(error, 75); /*no null termination, corrupt?*/

    length = (unsigned)chunkLength - string2_begin;
    zlibsettings.max_output_size = decoder->max_text_size;
    /*will fail if zlib error, e.g. if length is too small*/
    error = zlib_decompress(&str, &size, 0, &data[string2_begin],
                            length, &zlibsettings);
    /*error: compressed text larger than  decoder->max_text_size*/
    if(error && size > zlibsettings.max_output_size) error = 112;
    if(error) break;
    error = lodepng_add_text_sized(info, key, (char*)str, size);
    break;
  }

  lodepng_free(key);
  lodepng_free(str);

  return error;
}